

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm.c
# Opt level: O0

void av1_round_shift_array_c(int32_t *arr,int size,int bit)

{
  int32_t iVar1;
  int64_t iVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  undefined4 local_14;
  
  if (in_EDX != 0) {
    if (in_EDX < 1) {
      for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
        iVar2 = clamp64((1L << (-(char)in_EDX & 0x3fU)) *
                        (long)*(int *)(in_RDI + (long)local_14 * 4),-0x80000000,0x7fffffff);
        *(int *)(in_RDI + (long)local_14 * 4) = (int)iVar2;
      }
    }
    else {
      for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
        iVar1 = round_shift((long)*(int *)(in_RDI + (long)local_14 * 4),in_EDX);
        *(int32_t *)(in_RDI + (long)local_14 * 4) = iVar1;
      }
    }
  }
  return;
}

Assistant:

void av1_round_shift_array_c(int32_t *arr, int size, int bit) {
  int i;
  if (bit == 0) {
    return;
  } else {
    if (bit > 0) {
      for (i = 0; i < size; i++) {
        arr[i] = round_shift(arr[i], bit);
      }
    } else {
      for (i = 0; i < size; i++) {
        arr[i] = (int32_t)clamp64(((int64_t)1 << (-bit)) * arr[i], INT32_MIN,
                                  INT32_MAX);
      }
    }
  }
}